

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O1

void * thread_decode(void *arg)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  FrmCrc *pFVar4;
  MPP_RET MVar5;
  int iVar6;
  undefined4 uVar7;
  RK_U32 size;
  uint uVar8;
  undefined8 uVar9;
  MppBufferGroup pvVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  long *plVar18;
  MppFrame unaff_RBP;
  MppFrame pvVar19;
  float fVar20;
  MppFrame frame;
  FileBufSlot *slot;
  char log_buf [256];
  MppFrame in_stack_fffffffffffffe28;
  undefined4 uVar21;
  MppFrame local_1b0;
  long *local_1a8;
  int local_19c;
  byte local_195;
  uint local_194;
  FileBufSlot *local_190;
  int local_184;
  FileBufSlot *local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  long local_150;
  FrmCrc *local_148;
  MppFrame local_140;
  FileBufSlot *local_138 [33];
  
  lVar15 = *arg;
  uVar12 = *(undefined8 *)((long)arg + 8);
  lVar1 = *(long *)((long)arg + 0x10);
  local_148 = (FrmCrc *)((long)arg + 0x88);
  *(undefined8 *)((long)arg + 0x88) = 0;
  *(undefined8 *)((long)arg + 0x90) = 0;
  *(undefined8 *)((long)arg + 0x98) = 0;
  *(undefined8 *)((long)arg + 0xa0) = 0;
  *(undefined8 *)((long)arg + 0xa8) = 0;
  *(undefined8 *)((long)arg + 0xb0) = 0;
  uVar9 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0x90) = uVar9;
  uVar9 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0xa8) = uVar9;
  local_150 = mpp_time();
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_1a8 = (long *)arg;
  if (*(int *)(lVar15 + 0x218) == 0) {
    uVar8 = *(uint *)(lVar15 + 0x204);
    if (((uVar8 & 0xf0000) == 0 && (uVar8 & 0xfffc) < 0x14) ||
       ((uVar8 & 0x1fff0) < 0x10010 && (uVar8 & 0xf0000) == 0x10000)) {
      iVar6 = (**(code **)(lVar1 + 0x70))(uVar12,0x31000a,(undefined4 *)(lVar15 + 0x204));
      if (iVar6 != 0) {
        _mpp_log_l(2,"mpi_dec_test","Failed to set output format 0x%x\n",0,
                   *(undefined4 *)(lVar15 + 0x204));
        return (void *)0x0;
      }
    }
    uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    iVar6 = *(int *)((long)arg + 0x1c);
    while (iVar6 == 0) {
      lVar15 = *arg;
      lVar1 = *(long *)((long)arg + 8);
      lVar11 = *(long *)((long)arg + 0x10);
      local_138[0] = (FileBufSlot *)0x0;
      local_190 = (FileBufSlot *)0x0;
      pvVar19 = *(MppFrame *)((long)arg + 0x38);
      local_1b0 = (MppFrame)0x0;
      lVar3 = *(long *)((long)arg + 0x18);
      local_180 = (FileBufSlot *)0x0;
      MVar5 = reader_index_read(*(FileReader *)(lVar15 + 0x240),0,&local_180);
      if (MVar5 != MPP_OK) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x115);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                   "dec_advanced",in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_00105450;
      }
      if (local_180 == (FileBufSlot *)0x0) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x116);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_advanced",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_00105450;
      }
      mpp_packet_init_with_buffer(local_138,local_180->buf);
      if (local_180->eos != 0) {
        mpp_packet_set_eos(local_138[0]);
      }
      lVar14 = mpp_packet_get_meta(local_138[0]);
      if (lVar14 != 0) {
        mpp_meta_set_frame(lVar14,0x6f66726d,pvVar19);
      }
      iVar6 = (**(code **)(lVar11 + 0x10))(lVar1,local_138[0]);
      if (iVar6 == 0) {
        if (local_1a8[10] == 0) {
          lVar14 = mpp_time();
          local_1a8[10] = lVar14;
        }
        iVar6 = (**(code **)(lVar11 + 0x18))(lVar1,&local_1b0);
        if (iVar6 != 0 || local_1b0 == (MppFrame)0x0) {
          pcVar16 = "%p mpp decode get frame failed ret %d frame %p\n";
          in_stack_fffffffffffffe28 = local_1b0;
          goto LAB_00105332;
        }
        if (local_1a8[0xb] == 0) {
          lVar11 = mpp_time();
          local_1a8[0xb] = lVar11;
        }
        if (local_1b0 != pvVar19) {
          _mpp_log_l(2,"mpi_dec_test","mismatch frame %p -> %p\n","dec_advanced",local_1b0,pvVar19);
        }
        if ((FILE *)local_1a8[8] != (FILE *)0x0) {
          dump_mpp_frame_to_file(local_1b0,(FILE *)local_1a8[8]);
        }
        pFVar4 = local_148;
        plVar18 = local_1a8;
        if (local_1a8[0x10] != 0) {
          calc_frm_crc(local_1b0,local_148);
          write_frm_crc((FILE *)plVar18[0x10],pFVar4);
        }
        if ((int)lVar3 == 0) {
          _mpp_log_l(4,"mpi_dec_test","%p decoded frame %d\n",0,lVar1,(int)local_1a8[9]);
        }
        *(int *)(local_1a8 + 9) = (int)local_1a8[9] + 1;
        iVar6 = mpp_frame_get_eos(local_1b0);
        if (((int)lVar3 == 0) && (iVar6 != 0)) {
          _mpp_log_l(4,"mpi_dec_test","%p found eos frame\n",0,lVar1);
        }
        fps_calc_inc(*(FpsCalc *)(lVar15 + 0x248));
        lVar15 = mpp_frame_get_meta(pvVar19);
        if (lVar15 == 0) {
LAB_00105304:
          iVar6 = *(int *)((long)local_1a8 + 0x4c);
          if (iVar6 < 1) {
            if ((iVar6 == 0) && (local_180->eos != 0)) goto LAB_00105346;
            goto LAB_0010534d;
          }
          if ((int)local_1a8[9] < iVar6) goto LAB_0010534d;
          goto LAB_00105346;
        }
        iVar6 = mpp_meta_get_packet(lVar15,0x69706b74,&local_190);
        if (iVar6 == 0 && local_190 != (FileBufSlot *)0x0) {
          if (local_190 != local_138[0]) {
            _mpp_log_l(2,"mpi_dec_test","mismatch packet %p -> %p\n","dec_advanced");
          }
          goto LAB_00105304;
        }
        _mpp_log_l(2,"mpi_dec_test","%p mpp meta get packet failed ret %d\n",0,lVar1,iVar6);
      }
      else {
        pcVar16 = "%p mpp decode put packet failed ret %d\n";
LAB_00105332:
        _mpp_log_l(2,"mpi_dec_test",pcVar16,0,lVar1,iVar6);
LAB_00105346:
        *(undefined4 *)((long)local_1a8 + 0x1c) = 1;
      }
LAB_0010534d:
      arg = local_1a8;
      mpp_packet_deinit(local_138);
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      iVar6 = *(int *)((long)arg + 0x1c);
    }
  }
  else if (*(int *)((long)arg + 0x1c) == 0) {
    do {
      plVar18 = local_1a8;
      local_168 = *local_1a8;
      lVar15 = local_1a8[1];
      lVar1 = local_1a8[2];
      local_170 = local_1a8[6];
      local_190 = (FileBufSlot *)0x0;
      local_194 = *(uint *)(local_1a8 + 3);
      uVar13 = (ulong)local_194;
      MVar5 = reader_read(*(FileReader *)(local_168 + 0x240),&local_190);
      if (MVar5 != MPP_OK) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x4e);
        uVar13 = 0;
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK","dec_simple",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) {
LAB_00105450:
          abort();
        }
      }
      if (local_190 == (FileBufSlot *)0x0) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x4f);
        uVar13 = 0;
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_simple",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_00105450;
      }
      local_174 = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
      if (local_190->eos != 0) {
        if ((*(int *)((long)plVar18 + 0x4c) < 0) ||
           ((int)plVar18[9] < *(int *)((long)plVar18 + 0x4c))) {
          if (local_194 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p loop again\n",0,lVar15);
          }
          reader_rewind(*(FileReader *)(local_168 + 0x240));
        }
        else {
          if (local_194 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,lVar15);
          }
          *(undefined4 *)((long)plVar18 + 0x1c) = 1;
          local_174 = 0;
        }
      }
      lVar11 = local_170;
      mpp_packet_set_data(local_170,local_190->data);
      mpp_packet_set_size(lVar11,local_190->size);
      mpp_packet_set_pos(lVar11,local_190->data);
      mpp_packet_set_length(lVar11,local_190->size);
      if ((char)local_174 == '\0') {
        mpp_packet_set_eos(local_170);
      }
      iVar6 = 0;
LAB_00104a1a:
      local_19c = 0;
      if (iVar6 == 0) {
        iVar6 = (**(code **)(lVar1 + 0x10))(lVar15,local_170);
        if (iVar6 == 0) {
          if (plVar18[10] != 0) goto LAB_00104a26;
          local_184 = 1;
          uVar7 = 0;
          lVar11 = mpp_time();
          plVar18[10] = lVar11;
        }
        else {
          local_184 = 0;
          uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
        }
      }
      else {
LAB_00104a26:
        local_184 = 1;
        uVar7 = 0;
      }
      local_195 = (byte)local_174 | (byte)uVar7;
      pvVar19 = (MppFrame)0x1e;
      local_160 = uVar7;
      do {
        unaff_RBP = pvVar19;
        uVar8 = (uint)unaff_RBP;
        local_1b0 = (MppFrame)0x0;
        while( true ) {
          iVar6 = (**(code **)(lVar1 + 0x18))(lVar15,&local_1b0);
          pvVar19 = unaff_RBP;
          if (iVar6 != -8) break;
          if ((int)unaff_RBP < 1) {
            _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed too much time\n",0,lVar15);
            pvVar19 = (MppFrame)(ulong)((int)uVar8 >> 0x1f & uVar8);
            break;
          }
          unaff_RBP = (MppFrame)(ulong)((int)unaff_RBP - 1);
          usleep(1000);
        }
        if (iVar6 == 0) {
          unaff_RBP = local_1b0;
          if (local_1b0 == (MppFrame)0x0) {
LAB_00104e0c:
            plVar18 = local_1a8;
            if ((local_1a8[5] != 0) &&
               (uVar13 = mpp_buffer_group_usage(), (ulong)plVar18[0xc] < uVar13)) {
              plVar18[0xc] = uVar13;
            }
            if (local_19c == 0 && local_195 == 0) {
              usleep(1000);
              local_19c = 0;
              iVar17 = 0x11;
            }
            else if (local_19c == 0) {
              if ((0 < *(int *)((long)plVar18 + 0x4c)) &&
                 (*(int *)((long)plVar18 + 0x4c) <= (int)plVar18[9])) {
                local_19c = 0;
                goto LAB_00104ae6;
              }
              iVar17 = 0x11 - (uint)(unaff_RBP == (MppFrame)0x0);
              local_19c = 0;
            }
            else {
              iVar17 = 0x10;
              if (local_194 == 0) {
                _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,lVar15);
              }
            }
          }
          else {
            local_140 = local_1b0;
            iVar6 = mpp_frame_get_info_change(local_1b0);
            if (iVar6 == 0) {
              uVar8 = mpp_frame_get_errinfo(local_1b0);
              local_19c = mpp_frame_get_discard(local_1b0);
              plVar18 = local_1a8;
              if (local_1a8[0xb] == 0) {
                lVar11 = mpp_time();
                plVar18[0xb] = lVar11;
              }
              iVar6 = snprintf((char *)local_138,0xff,"decode get frame %d",
                               (ulong)*(uint *)(plVar18 + 9));
              iVar17 = mpp_frame_has_meta(local_1b0);
              if (iVar17 != 0) {
                uVar12 = mpp_frame_get_meta(local_1b0);
                local_180 = (FileBufSlot *)((ulong)local_180 & 0xffffffff00000000);
                mpp_meta_get_s32(uVar12,0x746c6964,&local_180);
                iVar17 = snprintf((char *)((long)local_138 + (long)iVar6),(long)(0xff - iVar6),
                                  " tid %d",(ulong)local_180 & 0xffffffff);
                iVar6 = iVar6 + iVar17;
              }
              if (uVar8 != 0 || local_19c != 0) {
                snprintf((char *)((long)local_138 + (long)iVar6),(long)(0xff - iVar6),
                         " err %x discard %x",(ulong)uVar8);
              }
              if (local_194 == 0) {
                _mpp_log_l(4,"mpi_dec_test","%p %s\n",0,lVar15,local_138);
              }
              plVar18 = local_1a8;
              *(int *)(local_1a8 + 9) = (int)local_1a8[9] + 1;
              if ((FILE *)local_1a8[8] != (FILE *)0x0 && uVar8 == 0) {
                dump_mpp_frame_to_file(local_1b0,(FILE *)local_1a8[8]);
              }
              pFVar4 = local_148;
              if (plVar18[0x10] != 0) {
                calc_frm_crc(local_1b0,local_148);
                write_frm_crc((FILE *)plVar18[0x10],pFVar4);
              }
              fps_calc_inc(*(FpsCalc *)(local_168 + 0x248));
LAB_00104de9:
              local_19c = mpp_frame_get_eos(local_1b0);
              mpp_frame_deinit(&local_1b0);
              unaff_RBP = local_140;
              goto LAB_00104e0c;
            }
            local_154 = mpp_frame_get_width(local_1b0);
            local_158 = mpp_frame_get_height(local_1b0);
            local_15c = mpp_frame_get_hor_stride(local_1b0);
            uVar7 = mpp_frame_get_ver_stride(local_1b0);
            size = mpp_frame_get_buf_size(local_1b0);
            uVar21 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
            if (local_194 == 0) {
              _mpp_log_l(4,"mpi_dec_test","%p decode_get_frame get info changed found\n",0,lVar15);
              in_stack_fffffffffffffe28 = (MppFrame)CONCAT44(uVar21,local_158);
              _mpp_log_l(4,"mpi_dec_test",
                         "%p decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,lVar15
                         ,local_154,in_stack_fffffffffffffe28,local_15c,uVar7,size);
            }
            plVar18 = local_1a8;
            pvVar10 = dec_buf_mgr_setup((DecBufMgr)local_1a8[4],size,0x18,
                                        *(MppDecBufMode *)(local_168 + 0x230));
            iVar6 = (**(code **)(lVar1 + 0x70))(lVar15,0x310002,pvVar10);
            if (iVar6 == 0) {
              plVar18[5] = (long)pvVar10;
              iVar17 = 0;
              iVar6 = (**(code **)(lVar1 + 0x70))(lVar15,0x310003,0);
              if (iVar6 != 0) {
                pcVar16 = "%p info change ready failed ret %d\n";
                goto LAB_00104dcc;
              }
              unaff_RBP = (MppFrame)CONCAT71((int7)((ulong)plVar18 >> 8),1);
            }
            else {
              pcVar16 = "%p set buffer group failed ret %d\n";
LAB_00104dcc:
              unaff_RBP = (MppFrame)0x0;
              _mpp_log_l(2,"mpi_dec_test",pcVar16,0,lVar15,iVar6);
              iVar17 = 0x10;
            }
            if ((char)unaff_RBP != '\0') goto LAB_00104de9;
          }
        }
        else {
          _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed ret %d\n",0,iVar6,lVar15);
LAB_00104ae6:
          iVar17 = 0x10;
        }
        plVar18 = local_1a8;
        uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      } while (iVar17 != 0x10);
      iVar6 = *(int *)((long)local_1a8 + 0x4c);
      if (((iVar6 < 1) || ((int)local_1a8[9] < iVar6)) && ((iVar6 != 0 || (local_19c == 0)))) {
        if ((char)local_160 == '\0') goto LAB_00104f1f;
        usleep(1000);
        iVar6 = local_184;
        goto LAB_00104a1a;
      }
      *(undefined4 *)((long)local_1a8 + 0x1c) = 1;
LAB_00104f1f:
      arg = local_1a8;
    } while (*(int *)((long)local_1a8 + 0x1c) == 0);
  }
  lVar15 = mpp_time();
  lVar15 = lVar15 - local_150;
  *(long *)((long)arg + 0x70) = lVar15;
  fVar20 = ((float)(int)*(long *)((long)arg + 0x48) * 1e+06) / (float)lVar15;
  *(float *)((long)arg + 0x68) = fVar20;
  *(long *)((long)arg + 0x78) = *(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50);
  auVar2 = SEXT816(*(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50)) *
           SEXT816(0x20c49ba5e353f7cf);
  _mpp_log_l(SUB84((double)fVar20,0),4,"mpi_dec_test",
             "decode %d frames time %lld ms delay %3d ms fps %3.2f\n",0,
             (int)*(long *)((long)arg + 0x48),lVar15 / 1000,
             CONCAT44(uVar7,(int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)));
  if (*(long *)((long)arg + 0x90) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(long *)((long)arg + 0x90) = 0;
  if (*(long *)((long)arg + 0xa8) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(long *)((long)arg + 0xa8) = 0;
  return (void *)0x0;
}

Assistant:

void *thread_decode(void *arg)
{
    MpiDecLoopData *data = (MpiDecLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_S64 t_s, t_e;

    memset(&data->checkcrc, 0, sizeof(data->checkcrc));
    data->checkcrc.luma.sum = mpp_malloc(RK_ULONG, 512);
    data->checkcrc.chroma.sum = mpp_malloc(RK_ULONG, 512);

    t_s = mpp_time();

    if (cmd->simple) {
        while (!data->loop_end)
            dec_simple(data);
    } else {
        /* NOTE: change output format before jpeg decoding */
        if (MPP_FRAME_FMT_IS_YUV(cmd->format) || MPP_FRAME_FMT_IS_RGB(cmd->format)) {
            MPP_RET ret = mpi->control(ctx, MPP_DEC_SET_OUTPUT_FORMAT, &cmd->format);
            if (ret) {
                mpp_err("Failed to set output format 0x%x\n", cmd->format);
                return NULL;
            }
        }

        while (!data->loop_end)
            dec_advanced(data);
    }

    t_e = mpp_time();
    data->elapsed_time = t_e - t_s;
    data->frame_count = data->frame_count;
    data->frame_rate = (float)data->frame_count * 1000000 / data->elapsed_time;
    data->delay = data->first_frm - data->first_pkt;

    mpp_log("decode %d frames time %lld ms delay %3d ms fps %3.2f\n",
            data->frame_count, (RK_S64)(data->elapsed_time / 1000),
            (RK_S32)(data->delay / 1000), data->frame_rate);

    MPP_FREE(data->checkcrc.luma.sum);
    MPP_FREE(data->checkcrc.chroma.sum);

    return NULL;
}